

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O2

int __thiscall DIS::FastEntityStatePdu::getMarshalledSize(FastEntityStatePdu *this)

{
  undefined8 *puVar1;
  pointer pVVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  VariableParameter listElement;
  
  iVar4 = EntityInformationFamilyPdu::getMarshalledSize(&this->super_EntityInformationFamilyPdu);
  iVar4 = iVar4 + 0x84;
  lVar7 = 8;
  for (uVar6 = 0;
      pVVar2 = (this->_variableParameters).
               super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->_variableParameters).
                            super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 5);
      uVar6 = uVar6 + 1) {
    listElement._vptr_VariableParameter = (_func_int **)&PTR__VariableParameter_001c3670;
    listElement._24_7_ = SUB87((ulong)*(undefined8 *)(&pVVar2->field_0xf + lVar7) >> 8,0);
    puVar1 = (undefined8 *)((long)&pVVar2->_vptr_VariableParameter + lVar7);
    listElement._8_8_ = *puVar1;
    uVar3 = puVar1[1];
    listElement._variableParameterFields1._0_7_ = (undefined7)uVar3;
    listElement._variableParameterFields1._7_1_ = (undefined1)((ulong)uVar3 >> 0x38);
    iVar5 = VariableParameter::getMarshalledSize(&listElement);
    iVar4 = iVar4 + iVar5;
    VariableParameter::~VariableParameter(&listElement);
    lVar7 = lVar7 + 0x20;
  }
  return iVar4;
}

Assistant:

int FastEntityStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = EntityInformationFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 2;  // _site
   marshalSize = marshalSize + 2;  // _application
   marshalSize = marshalSize + 2;  // _entity
   marshalSize = marshalSize + 1;  // _forceId
   marshalSize = marshalSize + 1;  // _numberOfVariableParameters
   marshalSize = marshalSize + 1;  // _entityKind
   marshalSize = marshalSize + 1;  // _domain
   marshalSize = marshalSize + 2;  // _country
   marshalSize = marshalSize + 1;  // _category
   marshalSize = marshalSize + 1;  // _subcategory
   marshalSize = marshalSize + 1;  // _specific
   marshalSize = marshalSize + 1;  // _extra
   marshalSize = marshalSize + 1;  // _altEntityKind
   marshalSize = marshalSize + 1;  // _altDomain
   marshalSize = marshalSize + 2;  // _altCountry
   marshalSize = marshalSize + 1;  // _altCategory
   marshalSize = marshalSize + 1;  // _altSubcategory
   marshalSize = marshalSize + 1;  // _altSpecific
   marshalSize = marshalSize + 1;  // _altExtra
   marshalSize = marshalSize + 4;  // _xVelocity
   marshalSize = marshalSize + 4;  // _yVelocity
   marshalSize = marshalSize + 4;  // _zVelocity
   marshalSize = marshalSize + 8;  // _xLocation
   marshalSize = marshalSize + 8;  // _yLocation
   marshalSize = marshalSize + 8;  // _zLocation
   marshalSize = marshalSize + 4;  // _psi
   marshalSize = marshalSize + 4;  // _theta
   marshalSize = marshalSize + 4;  // _phi
   marshalSize = marshalSize + 4;  // _entityAppearance
   marshalSize = marshalSize + 1;  // _deadReckoningAlgorithm
   marshalSize = marshalSize + 15 * 1;  // _otherParameters
   marshalSize = marshalSize + 4;  // _xAcceleration
   marshalSize = marshalSize + 4;  // _yAcceleration
   marshalSize = marshalSize + 4;  // _zAcceleration
   marshalSize = marshalSize + 4;  // _xAngularVelocity
   marshalSize = marshalSize + 4;  // _yAngularVelocity
   marshalSize = marshalSize + 4;  // _zAngularVelocity
   marshalSize = marshalSize + 12 * 1;  // _marking
   marshalSize = marshalSize + 4;  // _capabilities

   for(unsigned long long idx=0; idx < _variableParameters.size(); idx++)
   {
        VariableParameter listElement = _variableParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}